

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_api.c
# Opt level: O1

WORD32 ihevcd_ctl(iv_obj_t *ps_codec_obj,void *pv_api_ip,void *pv_api_op)

{
  int iVar1;
  codec_t *ps_codec;
  undefined8 uVar2;
  WORD32 WVar3;
  IV_API_CALL_STATUS_T IVar4;
  WORD32 WVar5;
  ihevcd_cxa_ctl_degrade_op_t *ps_op;
  
  ps_codec = (codec_t *)ps_codec_obj->pv_codec_handle;
  if (ps_codec->i4_init_done == 1) {
    iVar1 = *(int *)((long)pv_api_ip + 8);
    WVar5 = 0;
    WVar3 = WVar5;
    if (iVar1 < 0x107) {
      WVar3 = 0;
      switch(iVar1) {
      case 0:
        ihevcd_get_status(ps_codec_obj,pv_api_ip,pv_api_op);
        WVar3 = WVar5;
        break;
      case 1:
        WVar3 = ihevcd_set_params(ps_codec_obj,pv_api_ip,pv_api_op);
        return WVar3;
      case 2:
        if (ps_codec == (codec_t *)0x0) {
          *(undefined4 *)((long)pv_api_op + 4) = 0xd0;
          WVar3 = WVar5;
        }
        else {
          ihevcd_init(ps_codec);
          WVar3 = WVar5;
        }
        break;
      case 3:
        ps_codec->e_pic_skip_mode = IVD_SKIP_DEFAULT;
        ps_codec->e_pic_out_order = IVD_DISPLAY_FRAME_OUT;
        ps_codec->i4_disp_strd = 0;
        ps_codec->i4_strd = 0;
        ps_codec->i4_header_mode = 0;
        *(undefined4 *)((long)pv_api_op + 4) = 0;
        WVar3 = 0;
        break;
      case 4:
        ps_codec->i4_flush_mode = 1;
        *(undefined4 *)((long)pv_api_op + 4) = 0;
        ps_codec->u4_pic_cnt = 0;
        ps_codec->u4_disp_cnt = 0;
        WVar3 = WVar5;
        break;
      case 5:
        ihevcd_get_buf_info(ps_codec_obj,pv_api_ip,pv_api_op);
        WVar3 = WVar5;
        break;
      case 6:
        *(undefined4 *)((long)pv_api_op + 4) = 0;
        if (((int)*(UWORD32 *)((long)pv_api_ip + 0x18) < 1) ||
           (IVar4 = ihevcd_get_version(*(CHAR **)((long)pv_api_ip + 0x10),
                                       *(UWORD32 *)((long)pv_api_ip + 0x18)), WVar3 = WVar5,
           IVar4 != IV_SUCCESS)) {
          *(undefined4 *)((long)pv_api_op + 4) = 0xd9;
          WVar3 = WVar5;
        }
        break;
      case 7:
        ps_codec->i4_num_cores = *(WORD32 *)((long)pv_api_ip + 0xc);
        *(undefined4 *)((long)pv_api_op + 4) = 0;
        WVar3 = WVar5;
        break;
      case 8:
        ihevcd_set_processor(ps_codec_obj,pv_api_ip,pv_api_op);
        WVar3 = WVar5;
      }
    }
    else if (iVar1 < 0x109) {
      if (iVar1 == 0x107) {
        ihevcd_get_frame_dimensions(ps_codec_obj,pv_api_ip,pv_api_op);
      }
      else if (iVar1 == 0x108) {
        WVar3 = ihevcd_get_vui_params(ps_codec_obj,pv_api_ip,pv_api_op);
        return WVar3;
      }
    }
    else {
      if (iVar1 == 0x109) {
        WVar3 = ihevcd_get_sei_mastering_params(ps_codec_obj,pv_api_ip,pv_api_op);
        return WVar3;
      }
      if (iVar1 == 0x307) {
        ps_codec->i4_degrade_type = *(WORD32 *)((long)pv_api_ip + 0x14);
        uVar2 = *(undefined8 *)((long)pv_api_ip + 0xc);
        ps_codec->i4_degrade_pics = (int)uVar2;
        ps_codec->i4_nondegrade_interval = (int)((ulong)uVar2 >> 0x20);
        *(undefined4 *)((long)pv_api_op + 4) = 0;
        ps_codec->i4_degrade_pic_cnt = 0;
        WVar3 = 0;
      }
    }
  }
  else {
    *(uint *)((long)pv_api_op + 4) = *(uint *)((long)pv_api_op + 4) | 0x40d0;
    WVar3 = 1;
  }
  return WVar3;
}

Assistant:

WORD32 ihevcd_ctl(iv_obj_t *ps_codec_obj, void *pv_api_ip, void *pv_api_op)
{
    ivd_ctl_set_config_ip_t *ps_ctl_ip;
    ivd_ctl_set_config_op_t *ps_ctl_op;
    WORD32 ret = 0;
    WORD32 subcommand;
    codec_t *ps_codec = (codec_t *)ps_codec_obj->pv_codec_handle;

    ps_ctl_ip = (ivd_ctl_set_config_ip_t *)pv_api_ip;
    ps_ctl_op = (ivd_ctl_set_config_op_t *)pv_api_op;

    if(ps_codec->i4_init_done != 1)
    {
        ps_ctl_op->u4_error_code |= 1 << IVD_FATALERROR;
        ps_ctl_op->u4_error_code |= IHEVCD_INIT_NOT_DONE;
        return IV_FAIL;
    }
    subcommand = ps_ctl_ip->e_sub_cmd;

    switch(subcommand)
    {
        case IVD_CMD_CTL_GETPARAMS:
            ret = ihevcd_get_status(ps_codec_obj, (void *)pv_api_ip,
                                    (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_SETPARAMS:
            ret = ihevcd_set_params(ps_codec_obj, (void *)pv_api_ip,
                                    (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_RESET:
            ret = ihevcd_reset(ps_codec_obj, (void *)pv_api_ip,
                               (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_SETDEFAULT:
        {
            ivd_ctl_set_config_op_t *s_ctl_dynparams_op =
                            (ivd_ctl_set_config_op_t *)pv_api_op;

            ret = ihevcd_set_default_params(ps_codec);
            if(IV_SUCCESS == ret)
                s_ctl_dynparams_op->u4_error_code = 0;
            break;
        }
        case IVD_CMD_CTL_FLUSH:
            ret = ihevcd_set_flush_mode(ps_codec_obj, (void *)pv_api_ip,
                                        (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_GETBUFINFO:
            ret = ihevcd_get_buf_info(ps_codec_obj, (void *)pv_api_ip,
                                      (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_GETVERSION:
        {
            ivd_ctl_getversioninfo_ip_t *ps_ip;
            ivd_ctl_getversioninfo_op_t *ps_op;
            IV_API_CALL_STATUS_T ret;
            ps_ip = (ivd_ctl_getversioninfo_ip_t *)pv_api_ip;
            ps_op = (ivd_ctl_getversioninfo_op_t *)pv_api_op;

            ps_op->u4_error_code = IV_SUCCESS;

            if((WORD32)ps_ip->u4_version_buffer_size <= 0)
            {
                ps_op->u4_error_code = IHEVCD_CXA_VERS_BUF_INSUFFICIENT;
                ret = IV_FAIL;
            }
            else
            {
                ret = ihevcd_get_version((CHAR *)ps_ip->pv_version_buffer,
                                         ps_ip->u4_version_buffer_size);
                if(ret != IV_SUCCESS)
                {
                    ps_op->u4_error_code = IHEVCD_CXA_VERS_BUF_INSUFFICIENT;
                    ret = IV_FAIL;
                }
            }
        }
            break;
        case IHEVCD_CXA_CMD_CTL_DEGRADE:
            ret = ihevcd_set_degrade(ps_codec_obj, (void *)pv_api_ip,
                            (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_SET_NUM_CORES:
            ret = ihevcd_set_num_cores(ps_codec_obj, (void *)pv_api_ip,
                                       (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_GET_BUFFER_DIMENSIONS:
            ret = ihevcd_get_frame_dimensions(ps_codec_obj, (void *)pv_api_ip,
                                              (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_GET_VUI_PARAMS:
            ret = ihevcd_get_vui_params(ps_codec_obj, (void *)pv_api_ip,
                                        (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_GET_SEI_MASTERING_PARAMS:
            ret = ihevcd_get_sei_mastering_params(ps_codec_obj, (void *)pv_api_ip,
                                        (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_SET_PROCESSOR:
            ret = ihevcd_set_processor(ps_codec_obj, (void *)pv_api_ip,
                            (void *)pv_api_op);
            break;
        default:
            DEBUG("\nDo nothing\n");
            break;
    }

    return ret;
}